

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_retcode vec_Alloc(CUPDLPvec *vec,cupdlp_int n)

{
  cupdlp_float *pcVar1;
  
  pcVar1 = (cupdlp_float *)calloc((long)n,8);
  vec->data = pcVar1;
  if (pcVar1 != (cupdlp_float *)0x0) {
    vec->len = n;
  }
  return (uint)(pcVar1 == (cupdlp_float *)0x0);
}

Assistant:

cupdlp_retcode vec_Alloc(CUPDLPvec *vec, cupdlp_int n) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_init_zero_vec_double(vec->data, n);
  vec->len = n;
#ifndef CUPDLP_CPU
  CHECK_CUSPARSE(
      cusparseCreateDnVec(&vec->cuda_vec, n, vec->data, CudaComputeType))
#endif

exit_cleanup:
  return retcode;
}